

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::InvalidShareContextCase::iterate(InvalidShareContextCase *this)

{
  EGLDisplay pvVar1;
  EGLConfig pvVar2;
  Library *pLVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  EGLContext pvVar6;
  undefined4 extraout_var;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_700;
  GetNameFunc local_6f0;
  int local_6e8;
  Enum<int,_2UL> local_6e0;
  MessageBuilder local_6d0;
  int local_54c;
  long lStack_548;
  EGLenum error;
  EGLContext contextB;
  EGLContext local_3c0;
  undefined1 local_3b8 [8];
  RenderingContext contextA;
  EGLint aEStack_208 [2];
  EGLint attribListB [9];
  EGLint aEStack_1d8 [2];
  EGLint attribListA [9];
  MessageBuilder local_1a8;
  byte local_21;
  Library *pLStack_20;
  bool isOk;
  Library *egl;
  TestLog *log;
  InvalidShareContextCase *this_local;
  
  log = (TestLog *)this;
  egl = (Library *)
        tcu::TestContext::getLog
                  ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  pLStack_20 = EglTestContext::getLibrary
                         ((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx);
  local_21 = 1;
  tcu::TestLog::operator<<(&local_1a8,(TestLog *)egl,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1a8,
                      (char (*) [105])
                      "EGL_BAD_MATCH is generated if reset notification strategies do not match when creating shared contexts\n\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  attribListA[2] = 0x30bf;
  attribListA[3] = 1;
  attribListA[4] = 0x3138;
  attribListA[5] = 0x31be;
  aEStack_1d8[0] = 0x3098;
  aEStack_1d8[1] = 3;
  attribListA[0] = 0x30fb;
  attribListA[1] = 1;
  attribListA[6] = 0x3038;
  attribListB[2] = 0x30bf;
  attribListB[3] = 1;
  attribListB[4] = 0x3138;
  attribListB[5] = 0x31bf;
  aEStack_208[0] = 0x3098;
  aEStack_208[1] = 3;
  attribListB[0] = 0x30fb;
  attribListB[1] = 1;
  attribListB[6] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,aEStack_1d8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&contextA.m_context,(TestLog *)egl,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&contextA.m_context,
                      (char (*) [50])"Create context A (share_context = EGL_NO_CONTEXT)");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&contextA.m_context);
  local_3c0 = (EGLContext)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_3b8,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,aEStack_1d8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&local_3c0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&contextB,(TestLog *)egl,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&contextB,
                      (char (*) [45])"Create context B (share_context = context A)");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&contextB);
  logAttribList((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,aEStack_208);
  pLVar3 = pLStack_20;
  pvVar1 = (this->super_RobustnessTestCase).m_eglDisplay;
  pvVar2 = (this->super_RobustnessTestCase).m_eglConfig;
  pvVar6 = RenderingContext::getContext((RenderingContext *)local_3b8);
  iVar4 = (*pLVar3->_vptr_Library[6])(pLVar3,pvVar1,pvVar2,pvVar6,aEStack_208);
  lStack_548 = CONCAT44(extraout_var,iVar4);
  local_54c = (*pLStack_20->_vptr_Library[0x1f])();
  if (local_54c != 0x3009) {
    tcu::TestLog::operator<<(&local_6d0,(TestLog *)egl,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_6d0,
                        (char (*) [54])"Test failed! eglCreateContext() returned with error [");
    EVar7 = eglu::getErrorStr(local_54c);
    local_6f0 = EVar7.m_getName;
    local_6e8 = EVar7.m_value;
    local_6e0.m_getName = local_6f0;
    local_6e0.m_value = local_6e8;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6e0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2c16365);
    EVar7 = eglu::getErrorStr(0x3009);
    local_700.m_getName = EVar7.m_getName;
    local_700.m_value = EVar7.m_value;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_700);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29dc08e);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6d0);
    local_21 = 0;
  }
  if (lStack_548 != 0) {
    (*pLStack_20->_vptr_Library[0x13])
              (pLStack_20,(this->super_RobustnessTestCase).m_eglDisplay,lStack_548);
  }
  if ((local_21 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  RenderingContext::~RenderingContext((RenderingContext *)local_3b8);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&		log		=	m_testCtx.getLog();
		const Library&	egl		=	m_eglTestCtx.getLibrary();
		bool			isOk	=	true;

		log << tcu::TestLog::Message
			<< "EGL_BAD_MATCH is generated if reset notification strategies do not match when creating shared contexts\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribListA[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_NO_RESET_NOTIFICATION,
			EGL_NONE
		};

		const EGLint attribListB[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribListA);

		log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribListA, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);

		log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		logAttribList(m_eglTestCtx, attribListB);

		EGLContext contextB = egl.createContext(m_eglDisplay, m_eglConfig, contextA.getContext(), attribListB);

		const EGLenum error = egl.getError();
		if (error != EGL_BAD_MATCH)
		{
			log << TestLog::Message
				<< "Test failed! eglCreateContext() returned with error [" << eglu::getErrorStr(error) << ", expected " << eglu::getErrorStr(EGL_BAD_MATCH) << "]"
				<< TestLog::EndMessage;

			isOk = false;
		}

		if (contextB != EGL_NO_CONTEXT)
			egl.destroyContext(m_eglDisplay, contextB);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}